

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  Arena *pAVar1;
  Message *pMVar2;
  Arena *pAVar3;
  Arena *pAVar4;
  Arena *this_00;
  
  if (sub_message != (Message *)0x0) {
    pAVar1 = (Arena *)(sub_message->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = pAVar1;
    if (((ulong)pAVar1 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
    }
    this_00 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    pAVar4 = this_00;
    if (((ulong)this_00 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)this_00 & 0xfffffffffffffffe);
    }
    if (pAVar3 != pAVar4) {
      if (((ulong)pAVar1 & 1) != 0) {
        pAVar1 = *(Arena **)((ulong)pAVar1 & 0xfffffffffffffffe);
      }
      if (pAVar1 == (Arena *)0x0) {
        if (((ulong)this_00 & 1) != 0) {
          this_00 = *(Arena **)((ulong)this_00 & 0xfffffffffffffffe);
        }
        if (this_00 != (Arena *)0x0) {
          Arena::Own<google::protobuf::Message>(this_00,sub_message);
          goto LAB_002ea778;
        }
      }
      pMVar2 = MutableMessage(this,message,field,(MessageFactory *)0x0);
      (*(pMVar2->super_MessageLite)._vptr_MessageLite[0xe])(pMVar2,sub_message);
      return;
    }
  }
LAB_002ea778:
  UnsafeArenaSetAllocatedMessage(this,message,sub_message,field);
  return;
}

Assistant:

void Reflection::SetAllocatedMessage(Message* message, Message* sub_message,
                                     const FieldDescriptor* field) const {
  // If message and sub-message are in different memory ownership domains
  // (different arenas, or one is on heap and one is not), then we may need to
  // do a copy.
  if (sub_message != nullptr &&
      sub_message->GetArena() != message->GetArena()) {
    if (sub_message->GetArena() == nullptr && message->GetArena() != nullptr) {
      // Case 1: parent is on an arena and child is heap-allocated. We can add
      // the child to the arena's Own() list to free on arena destruction, then
      // set our pointer.
      message->GetArena()->Own(sub_message);
      UnsafeArenaSetAllocatedMessage(message, sub_message, field);
    } else {
      // Case 2: all other cases. We need to make a copy. MutableMessage() will
      // either get the existing message object, or instantiate a new one as
      // appropriate w.r.t. our arena.
      Message* sub_message_copy = MutableMessage(message, field);
      sub_message_copy->CopyFrom(*sub_message);
    }
  } else {
    // Same memory ownership domains.
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
  }
}